

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.h
# Opt level: O0

btBroadphasePair * __thiscall
btHashedOverlappingPairCache::internalFindPair
          (btHashedOverlappingPairCache *this,btBroadphaseProxy *proxy0,btBroadphaseProxy *proxy1,
          int hash)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  int in_ECX;
  btBroadphaseProxy *in_RDX;
  btBroadphaseProxy *in_RSI;
  btBroadphasePair *in_RDI;
  int index;
  int proxyId2;
  int proxyId1;
  int in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  int n;
  btBroadphasePair *local_8;
  
  btBroadphaseProxy::getUid(in_RSI);
  iVar2 = btBroadphaseProxy::getUid(in_RDX);
  piVar3 = btAlignedObjectArray<int>::operator[]
                     ((btAlignedObjectArray<int> *)&in_RDI[1].m_algorithm,in_ECX);
  n = *piVar3;
  while( true ) {
    in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 & 0xffffff;
    if (n != -1) {
      btAlignedObjectArray<btBroadphasePair>::operator[]
                ((btAlignedObjectArray<btBroadphasePair> *)&in_RDI->m_pProxy1,n);
      bVar1 = equalsPair((btHashedOverlappingPairCache *)CONCAT44(iVar2,n),in_RDI,
                         in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
      in_stack_ffffffffffffffc4 = CONCAT13(!bVar1,(int3)in_stack_ffffffffffffffc4);
    }
    if ((char)(in_stack_ffffffffffffffc4 >> 0x18) == '\0') break;
    piVar3 = btAlignedObjectArray<int>::operator[]
                       ((btAlignedObjectArray<int> *)&in_RDI[2].m_algorithm,n);
    n = *piVar3;
  }
  if (n == -1) {
    local_8 = (btBroadphasePair *)0x0;
  }
  else {
    local_8 = btAlignedObjectArray<btBroadphasePair>::operator[]
                        ((btAlignedObjectArray<btBroadphasePair> *)&in_RDI->m_pProxy1,n);
  }
  return local_8;
}

Assistant:

SIMD_FORCE_INLINE btBroadphasePair* internalFindPair(btBroadphaseProxy* proxy0, btBroadphaseProxy* proxy1, int hash)
	{
		int proxyId1 = proxy0->getUid();
		int proxyId2 = proxy1->getUid();
		#if 0 // wrong, 'equalsPair' use unsorted uids, copy-past devil striked again. Nat.
		if (proxyId1 > proxyId2) 
			btSwap(proxyId1, proxyId2);
		#endif

		int index = m_hashTable[hash];
		
		while( index != BT_NULL_PAIR && equalsPair(m_overlappingPairArray[index], proxyId1, proxyId2) == false)
		{
			index = m_next[index];
		}

		if ( index == BT_NULL_PAIR )
		{
			return NULL;
		}

		btAssert(index < m_overlappingPairArray.size());

		return &m_overlappingPairArray[index];
	}